

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareNextTestCase
          (LengthOfVectorAndMatrixTest *this,GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *__s;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this->m_current_test_case_index = 0;
  }
  else {
    ptVar1 = (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->m_test_cases).
                   super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1 >> 2) *
            -0x5555555555555555;
    uVar4 = (ulong)test_case_index;
    if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
      return false;
    }
    local_198 = *(undefined1 (*) [8])(**(long **)&this->field_0x70 + 0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"Tested type: ",0xd);
    __s = Utils::getTypeName(ptVar1[uVar4].m_type,ptVar1[uVar4].m_n_cols,ptVar1[uVar4].m_n_rows);
    if (__s == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,__s,sVar2);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
  }
  return true;
}

Assistant:

bool LengthOfVectorAndMatrixTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		m_current_test_case_index = 0;
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Tested type: "
										<< Utils::getTypeName(test_case.m_type, test_case.m_n_cols, test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}